

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

bool anon_unknown.dwarf_17e46d::checkPixels<half>
               (Array2D<half> *ph,int lx,int rx,int ly,int ry,int width)

{
  half *phVar1;
  ostream *poVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Array2D<half> *in_RDI;
  int in_R8D;
  int in_R9D;
  float f;
  float fVar4;
  int x;
  int y;
  undefined2 in_stack_ffffffffffffffd0;
  half in_stack_ffffffffffffffd2;
  int iVar5;
  int local_28;
  
  local_28 = in_ECX;
  do {
    iVar5 = in_ESI;
    if (in_R8D < local_28) {
      return true;
    }
    for (; iVar5 <= in_EDX; iVar5 = iVar5 + 1) {
      phVar1 = Imf_2_5::Array2D<half>::operator[](in_RDI,(long)local_28);
      f = half::operator_cast_to_float(phVar1 + iVar5);
      half::half((half *)CONCAT44(iVar5,CONCAT22(in_stack_ffffffffffffffd2._h,
                                                 in_stack_ffffffffffffffd0)),f);
      fVar4 = half::operator_cast_to_float((half *)&stack0xffffffffffffffd2);
      if ((f != fVar4) || (NAN(f) || NAN(fVar4))) {
        poVar2 = std::operator<<((ostream *)&std::cout,"value at ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar5);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
        poVar2 = std::operator<<(poVar2,": ");
        phVar1 = Imf_2_5::Array2D<half>::operator[](in_RDI,(long)local_28);
        poVar2 = (ostream *)::operator<<(poVar2,(half)phVar1[iVar5]._h);
        poVar2 = std::operator<<(poVar2,", should be ");
        pvVar3 = (void *)std::ostream::operator<<(poVar2,(local_28 * in_R9D + iVar5) % 0x801);
        pvVar3 = (void *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar3,std::flush<char,std::char_traits<char>>);
        return false;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

bool
checkPixels (Array2D<T> &ph, int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            if (ph[y][x] != static_cast<T>(((y * width + x) % 2049)))
            {
                cout << "value at " << x << ", " << y << ": " << ph[y][x]
                     << ", should be " << (y * width + x) % 2049 << endl << flush;
                return false;
            }
        }
    }

    return true;
}